

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureShadowTests.cpp
# Opt level: O2

TestCaseGroup * vkt::texture::createTextureShadowTests(TestContext *testCtx)

{
  TestCaseGroup *pTVar1;
  allocator<char> local_4a;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"shadow",&local_49);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Texture shadow tests.",&local_4a);
  pTVar1 = createTestGroup(testCtx,&local_28,&local_48,anon_unknown_0::populateTextureShadowTests);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createTextureShadowTests (tcu::TestContext& testCtx)
{
	return createTestGroup(testCtx, "shadow", "Texture shadow tests.", populateTextureShadowTests);
}